

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::CheckEvalRestriction(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  HostScriptContext *pHVar3;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  undefined1 local_68 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  void *__frameAddr;
  HostScriptContext *hostScriptContext;
  Var domError;
  ScriptContext *pSStack_10;
  HRESULT hr;
  ScriptContext *this_local;
  
  domError._4_4_ = 0;
  hostScriptContext = (HostScriptContext *)0x0;
  pSStack_10 = this;
  pHVar3 = GetHostScriptContext(this);
  LeaveScriptObject<true,_true,_false>::LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)
             &autoReentrancyHandler.m_savedReentrancySafeOrHandled,this,&this_local);
  pTVar4 = GetThreadContext(this);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_68,pTVar4);
  domError._4_4_ = (*pHVar3->_vptr_HostScriptContext[0xd])();
  if ((int)domError._4_4_ < 0) {
    domError._4_4_ =
         (*pHVar3->_vptr_HostScriptContext[0xe])(pHVar3,(ulong)domError._4_4_,&hostScriptContext);
    if (this != (ScriptContext *)0x0) {
      pTVar4 = GetThreadContext(this);
      ThreadContext::DisposeOnLeaveScript(pTVar4);
    }
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_68);
  LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
            ((LeaveScriptObject<true,_true,_false> *)
             &autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  if (bVar2) {
    return;
  }
  if ((int)domError._4_4_ < 0) {
    JavascriptError::MapAndThrowError(this,domError._4_4_);
  }
  if (hostScriptContext != (HostScriptContext *)0x0) {
    JavascriptExceptionOperators::Throw(hostScriptContext,this);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                              ,0x78a,"(false)","We should have thrown by now.");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
  JavascriptError::MapAndThrowError(this,-0x7fffbffb);
}

Assistant:

void ScriptContext::CheckEvalRestriction()
    {
        HRESULT hr = S_OK;
        Var domError = nullptr;
        HostScriptContext* hostScriptContext = this->GetHostScriptContext();

        BEGIN_LEAVE_SCRIPT(this)
        {
            if (!FAILED(hr = hostScriptContext->CheckEvalRestriction()))
            {
                return;
            }

            hr = hostScriptContext->HostExceptionFromHRESULT(hr, &domError);
        }
        END_LEAVE_SCRIPT(this);

        if (FAILED(hr))
        {
            Js::JavascriptError::MapAndThrowError(this, hr);
        }

        if (domError != nullptr)
        {
            JavascriptExceptionOperators::Throw(domError, this);
        }

        AssertMsg(false, "We should have thrown by now.");
        Js::JavascriptError::MapAndThrowError(this, E_FAIL);
    }